

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalInterfaceExamples.cpp
# Opt level: O2

void writeGZ2(char *fileName,half *gPixels,float *zPixels,int width,int height,Box2i *dataWindow)

{
  int iVar1;
  Vec2<int> *pVVar2;
  char *pcVar3;
  OutputFile file;
  undefined8 local_d0 [7];
  FrameBuffer frameBuffer;
  Header header;
  
  local_d0[0] = 0;
  Imf_3_2::Header::Header((Header *)0x3f800000,0x3f800000,&header,width,height,local_d0,0,3);
  pVVar2 = (Vec2<int> *)Imf_3_2::Header::dataWindow();
  *pVVar2 = dataWindow->min;
  pVVar2[1] = dataWindow->max;
  pcVar3 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel((Channel *)local_d0,HALF,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar3,(Channel *)"G");
  pcVar3 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel((Channel *)local_d0,FLOAT,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar3,(Channel *)"Z");
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::OutputFile::OutputFile(&file,fileName,&header,iVar1);
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_2::Slice::Slice
            ((Slice *)local_d0,HALF,(char *)gPixels,2,(long)width * 2,1,1,0.0,false,false);
  Imf_3_2::FrameBuffer::insert((char *)&frameBuffer,(Slice *)"G");
  Imf_3_2::Slice::Slice
            ((Slice *)local_d0,FLOAT,(char *)zPixels,4,(long)width << 2,1,1,0.0,false,false);
  Imf_3_2::FrameBuffer::insert((char *)&frameBuffer,(Slice *)"Z");
  Imf_3_2::OutputFile::setFrameBuffer((FrameBuffer *)&file);
  Imf_3_2::OutputFile::writePixels((int)&file);
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
               *)&frameBuffer);
  Imf_3_2::OutputFile::~OutputFile(&file);
  Imf_3_2::Header::~Header(&header);
  return;
}

Assistant:

void
writeGZ2 (
    const char   fileName[],
    const half*  gPixels,
    const float* zPixels,
    int          width,
    int          height,
    const Box2i& dataWindow)
{
    //
    // Write an image with only a G (green) and a Z (depth) channel,
    // using class OutputFile.  Don't store the whole image in the
    // file, but crop it according to the given data window.
    //
    //	- create a file header
    //	- set the header's data window
    //	- add G and Z channels to the header
    //	- open the file, and store the header in the file
    //	- describe the memory layout of the G anx Z pixels
    //	- store the pixels in the file
    //

    Header header (width, height);
    header.dataWindow () = dataWindow;
    header.channels ().insert ("G", Channel (IMF::HALF));
    header.channels ().insert ("Z", Channel (IMF::FLOAT));

    OutputFile file (fileName, header);

    FrameBuffer frameBuffer;

    frameBuffer.insert (
        "G", // name
        Slice (
            IMF::HALF,                   // type
            (char*) gPixels,             // base
            sizeof (*gPixels) * 1,       // xStride
            sizeof (*gPixels) * width)); // yStride

    frameBuffer.insert (
        "Z", // name
        Slice (
            IMF::FLOAT,                  // type
            (char*) zPixels,             // base
            sizeof (*zPixels) * 1,       // xStride
            sizeof (*zPixels) * width)); // yStride

    file.setFrameBuffer (frameBuffer);
    file.writePixels (dataWindow.max.y - dataWindow.min.y + 1);
}